

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight1.cpp
# Opt level: O1

bool gl_GetLight(int group,Plane *p,ADynamicLight *light,bool checkside,FDynLightData *ldata)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  float x;
  float fVar8;
  float y;
  float z;
  float fVar9;
  double dVar10;
  double dVar11;
  float local_3c;
  float local_38;
  float local_34;
  
  iVar5 = ((light->super_AActor).Sector)->PortalGroup;
  dVar10 = 0.0;
  dVar11 = 0.0;
  if (iVar5 != group) {
    iVar5 = group * Displacements.size + iVar5;
    dVar10 = Displacements.data.Array[iVar5].pos.X;
    dVar11 = Displacements.data.Array[iVar5].pos.Y;
  }
  x = (float)(dVar10 + (light->super_AActor).__Pos.X);
  y = (float)(light->super_AActor).__Pos.Z;
  z = (float)(dVar11 + (light->super_AActor).__Pos.Y);
  fVar8 = Plane::DistToPoint(p,x,y,z);
  if (((light->super_AActor).flags2.Value & 0x10000000) == 0) {
    fVar9 = light->m_currentRadius + light->m_currentRadius;
  }
  else {
    fVar9 = 0.0;
  }
  bVar3 = false;
  if ((0.0 < fVar9) && (bVar3 = false, ABS(fVar8) <= fVar9)) {
    if ((checkside) &&
       ((gl_lights_checkside.Value == true && (bVar3 = Plane::PointOnSide(p,x,y,z), bVar3)))) {
      return false;
    }
    uVar1 = (light->super_AActor).flags4.Value;
    uVar6 = uVar1 & 0x400;
    local_3c = *(float *)(&DAT_00726360 + (ulong)(uVar6 == 0) * 4);
    local_34 = (float)(byte)(light->super_AActor).args[0] * local_3c;
    local_38 = (float)(byte)(light->super_AActor).args[1] * local_3c;
    local_3c = (float)(byte)(light->super_AActor).args[2] * local_3c;
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar6 = uVar6 >> 9;
    }
    else {
      fVar8 = SQRT(local_3c * local_3c + local_38 * local_38 + local_34 * local_34);
      local_34 = fVar8 - local_34;
      local_38 = fVar8 - local_38;
      local_3c = fVar8 - local_3c;
      uVar6 = 1;
    }
    uVar7 = (ulong)(uVar6 << 4);
    TArray<float,_float>::Grow((TArray<float,_float> *)((long)&ldata->arrays[0].Array + uVar7),8);
    uVar1 = *(uint *)((long)&ldata->arrays[0].Count + uVar7);
    uVar4 = (ulong)uVar1;
    *(uint *)((long)&ldata->arrays[0].Count + uVar7) = uVar1 + 8;
    lVar2 = *(long *)((long)&ldata->arrays[0].Array + uVar7);
    *(float *)(lVar2 + uVar4 * 4) = x;
    *(float *)(lVar2 + 4 + uVar4 * 4) = y;
    *(float *)(lVar2 + 8 + uVar4 * 4) = z;
    *(float *)(lVar2 + 0xc + uVar4 * 4) = fVar9;
    *(float *)(lVar2 + 0x10 + uVar4 * 4) = local_34;
    *(float *)(lVar2 + 0x14 + uVar4 * 4) = local_38;
    *(float *)(lVar2 + 0x18 + uVar4 * 4) = local_3c;
    *(undefined4 *)(lVar2 + 0x1c + uVar4 * 4) = 0;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool gl_GetLight(int group, Plane & p, ADynamicLight * light, bool checkside, FDynLightData &ldata)
{
	int i = 0;

	DVector3 pos = light->PosRelative(group);
	
	float dist = fabsf(p.DistToPoint(pos.X, pos.Z, pos.Y));
	float radius = (light->GetRadius());
	
	if (radius <= 0.f) return false;
	if (dist > radius) return false;
	if (checkside && gl_lights_checkside && p.PointOnSide(pos.X, pos.Z, pos.Y))
	{
		return false;
	}


	float cs;
	if (light->IsAdditive()) 
	{
		cs = 0.2f;
		i = 2;
	}
	else 
	{
		cs = 1.0f;
	}

	float r = light->GetRed() / 255.0f * cs;
	float g = light->GetGreen() / 255.0f * cs;
	float b = light->GetBlue() / 255.0f * cs;

	if (light->IsSubtractive())
	{
		Vector v;
		
		v.Set(r, g, b);
		r = v.Length() - r;
		g = v.Length() - g;
		b = v.Length() - b;
		i = 1;
	}

	float *data = &ldata.arrays[i][ldata.arrays[i].Reserve(8)];
	data[0] = pos.X;
	data[1] = pos.Z;
	data[2] = pos.Y;
	data[3] = radius;
	data[4] = r;
	data[5] = g;
	data[6] = b;
	data[7] = 0;
	return true;
}